

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O2

void __thiscall
Trainer::Trainer<Kuhn::Game>::writeStrategyToBin(Trainer<Kuhn::Game> *this,int iteration)

{
  _Hash_node_base _Var1;
  _Hash_node_base *p_Var2;
  byte bVar3;
  double *pdVar4;
  ostream *poVar5;
  int i;
  ulong uVar6;
  __node_base *p_Var7;
  _Hash_node_base *p_Var8;
  string path;
  binary_oarchive oa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  p_Var7 = &(this->mNodeMap)._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var7[1]._M_nxt;
    p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
    for (p_Var8 = (_Hash_node_base *)0x0; p_Var2 != p_Var8;
        p_Var8 = (_Hash_node_base *)((long)&p_Var8->_M_nxt + 1)) {
      std::ostream::operator<<
                ((ostream *)&std::cout,
                 (int)*(char *)((long)&p_Var8->_M_nxt + (long)&(_Var1._M_nxt)->_M_nxt));
    }
    std::operator<<((ostream *)&std::cout,":");
    uVar6 = 0;
    while( true ) {
      bVar3 = Node::actionNum((Node *)p_Var7[5]._M_nxt);
      if (bVar3 <= uVar6) break;
      pdVar4 = Node::averageStrategy((Node *)p_Var7[5]._M_nxt);
      poVar5 = std::ostream::_M_insert<double>(pdVar4[uVar6]);
      std::operator<<(poVar5,",");
      uVar6 = uVar6 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (iteration < 1) {
    std::__cxx11::string::string((string *)&path,"strategy",(allocator *)&ofs);
  }
  else {
    std::__cxx11::to_string((string *)&ofs,iteration);
    std::operator+(&path,"strategy_",(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oa,"_",
                 this->mModeStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oa,".bin");
  std::__cxx11::string::append((string *)&path);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&oa);
  std::operator+(&local_250,&this->mFolderPath,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oa,&local_250
                 ,&path);
  std::ofstream::ofstream(&ofs,(string *)&oa,_S_out);
  std::__cxx11::string::~string((string *)&oa);
  std::__cxx11::string::~string((string *)&local_250);
  boost::archive::binary_oarchive::binary_oarchive(&oa,(ostream *)&ofs,0);
  boost::archive::detail::save_non_pointer_type<boost::archive::binary_oarchive>::save_standard::
  invoke<std::unordered_map<std::__cxx11::string,Trainer::Node*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Trainer::Node*>>>>
            (&oa,&this->mNodeMap);
  std::ofstream::close();
  boost::archive::
  binary_oarchive_impl<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>::
  ~binary_oarchive_impl
            (&oa.
              super_binary_oarchive_impl<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>
            );
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void Trainer<T>::writeStrategyToBin(const int iteration) const {
    for (auto &itr : mNodeMap) {
        for (char c : itr.first) {
            std::cout << int(c);
        }
        std::cout << ":";
        for (int i = 0; i < itr.second->actionNum(); ++i) {
            std::cout << itr.second->averageStrategy()[i] << ",";
        }
        std::cout << std::endl;
    }
    std::string path = iteration > 0 ? "strategy_" + std::to_string(iteration)
                                     : "strategy";
    path += "_" + mModeStr + ".bin";
    std::ofstream ofs(mFolderPath + "/" + path);
    boost::archive::binary_oarchive oa(ofs);
    oa << mNodeMap;
    ofs.close();
}